

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O1

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint64_t uVar2;
  ulong uVar3;
  TValue *pTVar4;
  bool bVar5;
  GCstr *key;
  cTValue *pcVar6;
  VMEvent key_00;
  GCtab *t;
  cTValue *pcVar7;
  
  uVar2 = (L->glref).ptr64;
  key = lj_str_new(L,"_VMEVENTS",9);
  pcVar6 = lj_tab_getstr((GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff),key);
  uVar3 = pcVar6->u64;
  pcVar6 = (cTValue *)(uVar3 >> 0x2f);
  if ((uint)(uVar3 >> 0x2f) == 0x1fff4) {
    key_00 = ev & 0xfffffff8;
    t = (GCtab *)(uVar3 & 0x7fffffffffff);
    if ((uint)key_00 < t->asize) {
      pcVar7 = (cTValue *)((long)key_00 * 8 + (t->array).ptr64);
    }
    else {
      pcVar6 = lj_tab_getinth(t,key_00);
      pcVar7 = pcVar6;
    }
    bVar5 = true;
    if ((pcVar7 != (cTValue *)0x0) && ((pcVar7->u64 & 0xffff800000000000) == 0xfffb800000000000)) {
      if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa1) {
        lj_state_growstack(L,0x14);
      }
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->u64 = pcVar7->u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      pTVar4->u64 = 0xffffffffffffffff;
      pcVar6 = (cTValue *)((long)L->top - (L->stack).ptr64);
      bVar5 = false;
    }
    if (!bVar5) {
      return (ptrdiff_t)pcVar6;
    }
  }
  pbVar1 = (byte *)(uVar2 + 0x93);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      if (LJ_FR2) setnilV(L->top++);
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}